

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_insert_elim_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::DeadInsertElimPass::EliminateDeadInserts(DeadInsertElimPass *this,Function *func)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  
  bVar1 = 0;
  do {
    bVar3 = bVar1;
    bVar2 = EliminateDeadInsertsOnePass(this,func);
    bVar1 = 1;
  } while (bVar2);
  return (bool)(bVar3 | bVar2);
}

Assistant:

bool DeadInsertElimPass::EliminateDeadInserts(Function* func) {
  bool modified = false;
  bool lastmodified = true;
  // Each pass can delete dead instructions, thus potentially revealing
  // new dead insertions ie insertions with no uses.
  while (lastmodified) {
    lastmodified = EliminateDeadInsertsOnePass(func);
    modified |= lastmodified;
  }
  return modified;
}